

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_primitives.h
# Opt level: O2

int int_of_substring(substring s)

{
  int iVar1;
  ostream *poVar3;
  char *pcVar4;
  char *__nptr;
  char *local_48 [2];
  char local_38 [16];
  char *endptr;
  long lVar2;
  
  pcVar4 = s.end;
  __nptr = s.begin;
  endptr = pcVar4;
  lVar2 = strtol(__nptr,&endptr,10);
  iVar1 = (int)lVar2;
  if (__nptr != pcVar4 && endptr == __nptr) {
    poVar3 = std::operator<<((ostream *)&std::cout,"warning: ");
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,__nptr,pcVar4);
    poVar3 = std::operator<<(poVar3,local_48[0]);
    poVar3 = std::operator<<(poVar3," is not a good int, replacing with 0");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)local_48);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

inline int int_of_substring(substring s)
{
  char* endptr = s.end;
  int i = strtol(s.begin, &endptr, 10);
  if (endptr == s.begin && s.begin != s.end)
  {
    std::cout << "warning: " << std::string(s.begin, s.end - s.begin).c_str() << " is not a good int, replacing with 0"
              << std::endl;
    i = 0;
  }

  return i;
}